

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O0

Mat * clearBg(Mat *plate)

{
  Mat *in_RSI;
  int in_R8D;
  Mat *local_480;
  Mat *local_458;
  Mat *local_438;
  _OutputArray local_418;
  Mat *local_400;
  Mat local_3f8 [96];
  Mat local_398 [96];
  Mat local_338 [96];
  Mat local_2d8 [96];
  Mat local_278 [96];
  Mat local_218 [96];
  Mat local_1b8 [96];
  Mat aMStack_158 [8];
  _OutputArray local_150;
  _InputArray local_138;
  _InputArray local_120;
  _InputArray local_f8;
  byte local_d9;
  Mat local_d8 [8];
  Mat alpha;
  Mat local_78 [8];
  Mat tmp;
  Mat *plate_local;
  Mat *dst;
  
  cv::Mat::Mat(local_78);
  cv::Mat::Mat(local_d8);
  local_d9 = 0;
  cv::Mat::Mat(plate);
  cv::_InputArray::_InputArray(&local_f8,in_RSI);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_120,local_78);
  cv::cvtColor((cv *)&local_f8,&local_120,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_120);
  cv::_InputArray::~_InputArray(&local_f8);
  cv::_InputArray::_InputArray(&local_138,local_78);
  cv::_OutputArray::_OutputArray(&local_150,local_d8);
  cv::threshold(&local_138,&local_150,1.0,255.0,0);
  cv::_OutputArray::~_OutputArray(&local_150);
  cv::_InputArray::~_InputArray(&local_138);
  local_438 = local_278;
  do {
    cv::Mat::Mat(local_438);
    local_438 = local_438 + 0x60;
  } while (local_438 != aMStack_158);
  cv::split(in_RSI,local_278);
  local_400 = local_3f8;
  cv::Mat::Mat(local_400,local_278);
  local_400 = local_398;
  cv::Mat::Mat(local_400,local_218);
  local_400 = local_338;
  cv::Mat::Mat(local_400,local_1b8);
  local_400 = local_2d8;
  cv::Mat::Mat(local_400,local_d8);
  cv::_OutputArray::_OutputArray(&local_418,plate);
  cv::merge(local_3f8,4,&local_418);
  cv::_OutputArray::~_OutputArray(&local_418);
  local_d9 = 1;
  local_458 = local_278;
  do {
    local_458 = local_458 + -0x60;
    cv::Mat::~Mat(local_458);
  } while (local_458 != local_3f8);
  local_480 = aMStack_158;
  do {
    local_480 = local_480 + -0x60;
    cv::Mat::~Mat(local_480);
  } while (local_480 != local_278);
  if ((local_d9 & 1) == 0) {
    cv::Mat::~Mat(plate);
  }
  cv::Mat::~Mat(local_d8);
  cv::Mat::~Mat(local_78);
  return plate;
}

Assistant:

cv::Mat clearBg(cv::Mat plate) {
    cv::Mat tmp, alpha, dst;
    cv::cvtColor(plate,tmp,cv::COLOR_BGR2GRAY);
    cv::threshold(tmp,alpha,1,255,cv::THRESH_BINARY);
    cv::Mat rgb[3];
    cv::split(plate,rgb);
    cv::Mat rgba[4]={rgb[0],rgb[1],rgb[2],alpha};
    cv::merge(rgba,4,dst);
    return dst;
}